

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::anon_unknown_0::BlockBasicTypeCase::BlockBasicTypeCase
          (BlockBasicTypeCase *this,TestContext *testCtx,char *name,char *description,VarType *type,
          deUint32 layoutFlags,int numInstances,MatrixLoadFlags matrixLoadFlag)

{
  BufferBlock *this_00;
  BufferVar local_90;
  BufferBlock *local_40;
  BufferBlock *block;
  VarType *pVStack_30;
  deUint32 layoutFlags_local;
  VarType *type_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  BlockBasicTypeCase *this_local;
  
  block._4_4_ = layoutFlags;
  pVStack_30 = type;
  type_local = (VarType *)description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,description,BUFFERMODE_PER_BLOCK,
             matrixLoadFlag);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockBasicTypeCase_016ac6e0;
  this_00 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_40 = this_00;
  BufferVar::BufferVar(&local_90,"var",pVStack_30,0x600);
  BufferBlock::addMember(this_00,&local_90);
  BufferVar::~BufferVar(&local_90);
  BufferBlock::setFlags(local_40,block._4_4_);
  if (0 < numInstances) {
    BufferBlock::setArraySize(local_40,numInstances);
    BufferBlock::setInstanceName(local_40,"block");
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])();
  return;
}

Assistant:

BlockBasicTypeCase (tcu::TestContext& testCtx, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase(testCtx, name, description, BUFFERMODE_PER_BLOCK, matrixLoadFlag)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", type, ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}

		init();
	}